

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

quaternion * dja::operator*=(quaternion *a,float_t *b)

{
  quaternion qVar1;
  
  qVar1 = operator*(*b,a);
  *a = qVar1;
  return a;
}

Assistant:

Q normalize(const Q& q) {return Q(normalize(V4(q)));}